

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int Fl::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  undefined8 in_RAX;
  char *__dest;
  int in_EDX;
  Atom AVar2;
  
  iVar1 = (int)src;
  if (-1 < iVar1 && dst != (EVP_PKEY_CTX *)0x0) {
    while (1 < in_EDX) {
      copy(dst,(EVP_PKEY_CTX *)((ulong)src & 0xffffffff));
      in_EDX = 1;
    }
    __dest = fl_selection_buffer[in_EDX];
    if (fl_selection_buffer_length[in_EDX] <= iVar1) {
      if (__dest != (char *)0x0) {
        operator_delete__(__dest);
      }
      __dest = (char *)operator_new__((ulong)(iVar1 + 100U));
      fl_selection_buffer[in_EDX] = __dest;
      fl_selection_buffer_length[in_EDX] = iVar1 + 100U;
    }
    memcpy(__dest,dst,(ulong)src & 0xffffffff);
    fl_selection_buffer[in_EDX][(ulong)src & 0xffffffff] = '\0';
    fl_selection_length[in_EDX] = iVar1;
    fl_i_own_selection[in_EDX] = '\x01';
    fl_selection_type[in_EDX] = "text/plain";
    AVar2 = CLIPBOARD;
    if (in_EDX == 0) {
      AVar2 = 1;
    }
    iVar1 = XSetSelectionOwner(fl_display,AVar2,fl_message_window,fl_event_time);
    return iVar1;
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),dst == (EVP_PKEY_CTX *)0x0);
}

Assistant:

void Fl::copy(const char *stuff, int len, int clipboard, const char *type) {
  if (!stuff || len<0) return;

  if (clipboard >= 2) {
    copy(stuff, len, 0, type);
    copy(stuff, len, 1, type);
    return;
  }

  if (len+1 > fl_selection_buffer_length[clipboard]) {
    delete[] fl_selection_buffer[clipboard];
    fl_selection_buffer[clipboard] = new char[len+100];
    fl_selection_buffer_length[clipboard] = len+100;
  }
  memcpy(fl_selection_buffer[clipboard], stuff, len);
  fl_selection_buffer[clipboard][len] = 0; // needed for direct paste
  fl_selection_length[clipboard] = len;
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_plain_text;
  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}